

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Mocap::ChFunction_Mocap(ChFunction_Mocap *this,ChFunction_Mocap *other)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index size;
  Index index;
  ulong uVar13;
  long lVar14;
  ActualDstType actualDst_1;
  ActualDstType actualDst_2;
  ActualDstType actualDst;
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Mocap_00b6cd50;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  Set_samples(this,other->samples);
  dVar3 = other->samp_freq;
  this->samp_freq = dVar3;
  this->timetot = (double)this->samples / dVar3;
  pdVar4 = (other->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar13 = (other->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar13) {
    Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,uVar13
               ,1);
  }
  uVar5 = (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar5 == uVar13) {
    pdVar6 = (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    uVar13 = uVar5 + 7;
    if (-1 < (long)uVar5) {
      uVar13 = uVar5;
    }
    uVar13 = uVar13 & 0xfffffffffffffff8;
    if (7 < (long)uVar5) {
      lVar14 = 0;
      do {
        pdVar1 = pdVar4 + lVar14;
        dVar3 = pdVar1[1];
        dVar7 = pdVar1[2];
        dVar8 = pdVar1[3];
        dVar9 = pdVar1[4];
        dVar10 = pdVar1[5];
        dVar11 = pdVar1[6];
        dVar12 = pdVar1[7];
        pdVar2 = pdVar6 + lVar14;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar3;
        pdVar2[2] = dVar7;
        pdVar2[3] = dVar8;
        pdVar2[4] = dVar9;
        pdVar2[5] = dVar10;
        pdVar2[6] = dVar11;
        pdVar2[7] = dVar12;
        lVar14 = lVar14 + 8;
      } while (lVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar5) {
      do {
        pdVar6[uVar13] = pdVar4[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
    pdVar4 = (other->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar13 = (other->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar13) {
      Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,
                 uVar13,1);
    }
    uVar5 = (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    if (uVar5 == uVar13) {
      pdVar6 = (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar13 = uVar5 + 7;
      if (-1 < (long)uVar5) {
        uVar13 = uVar5;
      }
      uVar13 = uVar13 & 0xfffffffffffffff8;
      if (7 < (long)uVar5) {
        lVar14 = 0;
        do {
          pdVar1 = pdVar4 + lVar14;
          dVar3 = pdVar1[1];
          dVar7 = pdVar1[2];
          dVar8 = pdVar1[3];
          dVar9 = pdVar1[4];
          dVar10 = pdVar1[5];
          dVar11 = pdVar1[6];
          dVar12 = pdVar1[7];
          pdVar2 = pdVar6 + lVar14;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar3;
          pdVar2[2] = dVar7;
          pdVar2[3] = dVar8;
          pdVar2[4] = dVar9;
          pdVar2[5] = dVar10;
          pdVar2[6] = dVar11;
          pdVar2[7] = dVar12;
          lVar14 = lVar14 + 8;
        } while (lVar14 < (long)uVar13);
      }
      if ((long)uVar13 < (long)uVar5) {
        do {
          pdVar6[uVar13] = pdVar4[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar5 != uVar13);
      }
      pdVar4 = (other->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar13 = (other->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if ((this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows != uVar13) {
        Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->array_y_dtdt).
                    super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,uVar13,1);
      }
      uVar5 = (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      if (uVar5 == uVar13) {
        pdVar6 = (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar13 = uVar5 + 7;
        if (-1 < (long)uVar5) {
          uVar13 = uVar5;
        }
        uVar13 = uVar13 & 0xfffffffffffffff8;
        if (7 < (long)uVar5) {
          lVar14 = 0;
          do {
            pdVar1 = pdVar4 + lVar14;
            dVar3 = pdVar1[1];
            dVar7 = pdVar1[2];
            dVar8 = pdVar1[3];
            dVar9 = pdVar1[4];
            dVar10 = pdVar1[5];
            dVar11 = pdVar1[6];
            dVar12 = pdVar1[7];
            pdVar2 = pdVar6 + lVar14;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar3;
            pdVar2[2] = dVar7;
            pdVar2[3] = dVar8;
            pdVar2[4] = dVar9;
            pdVar2[5] = dVar10;
            pdVar2[6] = dVar11;
            pdVar2[7] = dVar12;
            lVar14 = lVar14 + 8;
          } while (lVar14 < (long)uVar13);
        }
        if ((long)uVar13 < (long)uVar5) {
          do {
            pdVar6[uVar13] = pdVar4[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar5 != uVar13);
        }
        return;
      }
    }
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Array<double, -1, 1>, SrcXprType = Eigen::Array<double, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

ChFunction_Mocap::ChFunction_Mocap(const ChFunction_Mocap& other) {
    Set_samples(other.samples);  // this creates arrays
    Set_samp_freq(other.samp_freq);

    array_y = other.array_y;
    array_y_dt = other.array_y_dt;
    array_y_dtdt = other.array_y_dtdt;
}